

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::localityModifiers(string *unit,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  string *this;
  long lVar9;
  precise_unit pVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nunit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (unit->_M_string_length < 3) {
LAB_001704e5:
    pVar10.base_units_ = (unit_data)0xfa94a488;
    pVar10.commodity_ = 0;
    pVar10.multiplier_ = NAN;
  }
  else {
    pcVar2 = (unit->_M_dataplus)._M_p;
    if ((*pcVar2 == 'u') && ((pcVar2[1] == 'S' || (pcVar2[1] == 'K')))) {
      *pcVar2 = 'U';
    }
    for (lVar9 = 8; lVar9 != 1000; lVar9 = lVar9 + 0x10) {
      pcVar2 = *(char **)(wordModifiers(std::__cxx11::string&)::modifiers + lVar9 + 0x4d8);
      sVar7 = strlen(pcVar2);
      if (sVar7 == 2) {
        pcVar3 = *(char **)((long)&localityModifiers::internationlReplacements._M_elems[0].first +
                           lVar9);
        iVar6 = strncmp(pcVar2,pcVar3,2);
        if (iVar6 != 0) {
LAB_001705b5:
          pcVar3 = (unit->_M_dataplus)._M_p;
          cVar1 = pcVar3[1];
          if (0 < cVar1) {
            iVar6 = isupper((int)cVar1);
            if (iVar6 != 0) {
              iVar6 = toupper((int)*pcVar3);
              if ((iVar6 == *pcVar2) && (cVar1 == pcVar2[1])) {
                *pcVar3 = (char)iVar6;
              }
            }
          }
          goto LAB_001705e9;
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_90,'\x01');
        std::operator+(&nunit,&local_90,pcVar3);
        bVar4 = ends_with(unit,&nunit);
        std::__cxx11::string::~string((string *)&nunit);
        std::__cxx11::string::~string((string *)&local_90);
        if (!bVar4) goto LAB_001705b5;
      }
      else {
LAB_001705e9:
        uVar8 = std::__cxx11::string::find((char *)unit,(ulong)pcVar2);
        if (uVar8 != 0xffffffffffffffff) {
          sVar7 = strlen(pcVar2);
          if (sVar7 == unit->_M_string_length) goto LAB_0017074b;
          std::__cxx11::string::erase((ulong)unit,uVar8);
          if ((uVar8 != 0) && ((unit->_M_dataplus)._M_p[uVar8 - 1] == '_')) {
            std::__cxx11::string::erase((ulong)unit,uVar8 - 1);
          }
          if ((uVar8 < unit->_M_string_length) && ((unit->_M_dataplus)._M_p[uVar8] == '_')) {
            std::__cxx11::string::erase((ulong)unit,uVar8);
          }
          std::__cxx11::string::push_back((char)unit);
          std::__cxx11::string::append((char *)unit);
          bVar4 = true;
          goto LAB_00170698;
        }
      }
    }
    bVar4 = false;
LAB_00170698:
    bVar5 = clearEmptySegments(unit);
    if (bVar5 || bVar4) {
      std::__cxx11::string::string((string *)&local_50,(string *)unit);
      pVar10 = unit_from_string_internal(&local_50,match_flags | 0xc00000);
      std::__cxx11::string::~string((string *)&local_50);
      if ((((uint)match_flags >> 0x16 & 1) == 0) &&
         (NAN(pVar10.multiplier_) || (pVar10._8_8_ & 0xffffffff) == 0xfa94a488)) {
        std::__cxx11::string::string((string *)&local_70,(string *)unit);
        pVar10 = localityModifiers(&local_70,match_flags | 0x400000);
        this = &local_70;
LAB_00170737:
        std::__cxx11::string::~string((string *)this);
      }
    }
    else if (unit->_M_string_length < 4) {
LAB_0017074b:
      pVar10.base_units_ = (unit_data)0xfa94a488;
      pVar10.commodity_ = 0;
      pVar10.multiplier_ = NAN;
    }
    else {
      lVar9 = 0;
      do {
        if (lVar9 == 0x38) goto LAB_001704e5;
        pcVar2 = *(char **)((long)localityModifiers::rotSequences._M_elems + lVar9);
        iVar6 = std::__cxx11::string::compare((ulong)unit,0,(char *)0x2);
        if (iVar6 == 0) {
          std::__cxx11::string::substr((ulong)&nunit,(ulong)unit);
          if (nunit._M_dataplus._M_p[nunit._M_string_length - 1] == 's') {
            std::__cxx11::string::pop_back();
          }
          std::__cxx11::string::push_back((char)&nunit);
          std::__cxx11::string::append((char *)&nunit);
          pVar10 = get_unit(&nunit,match_flags);
          this = &nunit;
          goto LAB_00170737;
        }
        std::__cxx11::string::string((string *)&nunit,pcVar2,(allocator *)&local_90);
        bVar4 = ends_with(unit,&nunit);
        std::__cxx11::string::~string((string *)&nunit);
        lVar9 = lVar9 + 8;
      } while (!bVar4);
      std::__cxx11::string::insert
                (unit,(unit->_M_dataplus)._M_p + (unit->_M_string_length - 2),0x5f);
      pVar10 = get_unit(unit,match_flags);
    }
  }
  return pVar10;
}

Assistant:

static precise_unit
    localityModifiers(std::string unit, std::uint64_t match_flags)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 62>
        internationlReplacements{{
            ckpair{"internationaltable", "IT"},
            ckpair{"internationalsteamtable", "IT"},
            ckpair{"international", "i"},
            ckpair{"USandBritish", "av"},
            ckpair{"US&British", "av"},
            ckpair{"USAsurvey", "US"},
            ckpair{"USsurvey", "US"},
            ckpair{"USSurvey", "US"},
            ckpair{"USdry", "US"},
            ckpair{"USA", "US"},
            ckpair{"USstatute", "US"},
            ckpair{"statutory", "US"},
            ckpair{"statute", "US"},
            ckpair{"US", "US"},
            ckpair{"shipping", "ship"},
            ckpair{"gregorian", "g"},
            ckpair{"Gregorian", "g"},
            ckpair{"synodic", "s"},
            ckpair{"sidereal", "sdr"},
            ckpair{"julian", "j"},
            ckpair{"Julian", "j"},
            ckpair{"thermochemical", "th"},
            ckpair{"hydraulic", "mech"},
            ckpair{"Th", "th"},
            ckpair{"(th)", "th"},
            ckpair{"metric", "m"},
            ckpair{"mean", "m"},
            ckpair{"imperial", "br"},
            ckpair{"Imperial", "br"},
            ckpair{"English", "br"},
            ckpair{"imp", "br"},
            ckpair{"wine", "wine"},
            ckpair{"beer", "wine"},
            ckpair{"(IT)", "IT"},
            ckpair{"troy", "tr"},
            ckpair{"apothecary", "ap"},
            ckpair{"apothecaries", "ap"},
            ckpair{"avoirdupois", "av"},
            ckpair{"Chinese", "cn"},
            ckpair{"chinese", "cn"},
            ckpair{"Canadian", "ca"},
            ckpair{"canadian", "ca"},
            ckpair{"survey", "US"},
            ckpair{"tropical", "t"},
            ckpair{"British", "br"},
            ckpair{"british", "br"},
            ckpair{"Br", "br"},
            ckpair{"BR", "br"},
            ckpair{"UK", "br"},
            ckpair{"conventional", "90"},
            ckpair{"AC", "ac"},
            ckpair{"DC", "dc"},
            ckpair{"fluid", "FL"},
            ckpair{"liquid", "FL"},
            ckpair{"fl", "FL"},
            ckpair{"15degC", "[15]"},
            ckpair{"20degC", "[20]"},
            ckpair{"59degF", "[59]"},
            ckpair{"60degF", "[60]"},
            ckpair{"39degF", "[39]"},
            ckpair{"0degC", "[00]"},
            // this should be last

            ckpair{"us", "US"},
        }};
    if (unit.size() < 3) {
        return precise::invalid;
    }
    if (unit.front() == 'u' && (unit[1] == 'S' || unit[1] == 'K')) {
        unit.front() = 'U';
    }
    bool changed = false;
    for (const auto& irep : internationlReplacements) {
        if (strlen(irep.first) == 2) {
            if (strncmp(irep.first, irep.second, 2) == 0) {
                if (ends_with(unit, std::string(1, '_') + irep.second)) {
                    continue;
                }
            }
            if (unit[1] > 0 && (std::isupper(unit[1]) != 0) &&
                (std::toupper(unit[0]) == irep.first[0]) &&
                (unit[1] == irep.first[1])) {
                unit[0] = std::toupper(unit[0]);
            }
        }
        auto fnd = unit.find(irep.first);
        if (fnd != std::string::npos) {
            auto len = strlen(irep.first);
            if (len == unit.size()) {  // this is a modifier if we are checking
                                       // the entire unit this is automatically
                                       // false
                return precise::invalid;
            }
            unit.erase(fnd, len);
            if (fnd > 0 && unit[fnd - 1] == '_') {
                unit.erase(fnd - 1, 1);
            }
            if (fnd < unit.size() && unit[fnd] == '_') {
                unit.erase(fnd, 1);
            }
            unit.push_back('_');
            unit.append(irep.second);
            changed = true;
            break;
        }
    }
    changed |= clearEmptySegments(unit);
    if (changed) {
        auto retunit = unit_from_string_internal(
            unit, match_flags | no_locality_modifiers | no_of_operator);
        if (is_error(retunit) && ((match_flags & no_locality_modifiers) == 0)) {
            return localityModifiers(unit, match_flags | no_locality_modifiers);
        }
        return retunit;
    }
    if (unit.size() < 4) {
        return precise::invalid;
    }
    static constexpr std::array<const char*, 7> rotSequences{
        {"br", "av", "ch", "IT", "th", "ap", "tr"}};
    for (const auto& seq : rotSequences) {
        if (unit.compare(0, 2, seq) == 0) {
            auto nunit = unit.substr((unit[3] == '_') ? 3 : 2);
            if (nunit.back() == 's') {
                nunit.pop_back();
            }
            nunit.push_back('_');
            nunit.append(seq);
            return get_unit(nunit, match_flags);
        }
        if (ends_with(unit, seq)) {
            unit.insert(unit.end() - 2, '_');
            return get_unit(unit, match_flags);
        }
    }

    return precise::invalid;
}